

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O0

void __thiscall State::AddValidation(State *this,Edge *edge,StringPiece path,uint64_t slash_bits)

{
  Node *local_38;
  Node *node;
  uint64_t slash_bits_local;
  Edge *edge_local;
  State *this_local;
  StringPiece path_local;
  
  path_local.str_ = (char *)path.len_;
  this_local = (State *)path.str_;
  node = (Node *)slash_bits;
  slash_bits_local = (uint64_t)edge;
  edge_local = (Edge *)this;
  local_38 = GetNode(this,path,slash_bits);
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back
            ((vector<Node_*,_std::allocator<Node_*>_> *)(slash_bits_local + 0x40),&local_38);
  Node::AddValidationOutEdge(local_38,(Edge *)slash_bits_local);
  return;
}

Assistant:

void State::AddValidation(Edge* edge, StringPiece path, uint64_t slash_bits) {
  Node* node = GetNode(path, slash_bits);
  edge->validations_.push_back(node);
  node->AddValidationOutEdge(edge);
}